

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

Maybe<kj::Exception> *
capnp::compiler::anon_unknown_0::loadFile
          (Maybe<kj::Exception> *__return_storage_ptr__,Reader file,SchemaLoader *loader,
          bool allNodes,Maybe<kj::Own<capnp::MallocMessageBuilder>_> *messageBuilder,
          uint sharedOrdinalCount)

{
  MallocMessageBuilder *pMVar1;
  Reader brand;
  undefined1 auVar2 [40];
  Reader brand_00;
  Reader reader;
  uint64_t uVar3;
  StructSchema SVar4;
  StructSchema SVar5;
  long lVar6;
  uint in_R9D;
  Orphanage OVar7;
  Orphanage orphanage;
  Schema schema;
  Fault f;
  OrphanBuilder local_1a8 [2];
  Schema *local_168;
  Reader root;
  Compiler compiler;
  Module local_68;
  SegmentReader *local_60;
  CapTableReader *pCStack_58;
  void *local_50;
  WirePointer *pWStack_48;
  StructDataBitCount local_40;
  StructPointerCount SStack_3c;
  undefined2 uStack_3a;
  int iStack_38;
  undefined4 uStack_34;
  
  SVar5.super_Schema.raw._4_4_ = 0;
  SVar5.super_Schema.raw._0_4_ = sharedOrdinalCount;
  Compiler::Compiler(&compiler,COMPILE_ANNOTATIONS);
  local_40 = file._reader.dataSize;
  SStack_3c = file._reader.pointerCount;
  uStack_3a = file._reader._38_2_;
  iStack_38 = file._reader.nestingLimit;
  uStack_34 = file._reader._44_4_;
  local_50 = file._reader.data;
  pWStack_48 = file._reader.pointers;
  local_60 = file._reader.segment;
  pCStack_58 = file._reader.capTable;
  local_68.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_0021bb10;
  uVar3 = Compiler::add(&compiler,&local_68);
  if (uVar3 == 0x8123456789abcdef) {
    if (allNodes) {
      Compiler::eagerlyCompile(&compiler,0x8123456789abcdef,0xffffffff);
      pMVar1 = (messageBuilder->ptr).ptr;
      if (pMVar1 != (MallocMessageBuilder *)0x0) {
        OVar7 = MessageBuilder::getOrphanage(&pMVar1->super_MessageBuilder);
        orphanage.arena = (BuilderArena *)OVar7.capTable;
        auVar2 = ZEXT1640(ZEXT816(0));
        brand._reader._40_8_ = 0x7fffffff;
        brand._reader.segment = (SegmentReader *)auVar2._0_8_;
        brand._reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand._reader.data = (void *)auVar2._16_8_;
        brand._reader.pointers = (WirePointer *)auVar2._24_8_;
        brand._reader.dataSize = auVar2._32_4_;
        brand._reader.pointerCount = auVar2._36_2_;
        brand._reader._38_2_ = auVar2._38_2_;
        root.schema.super_Schema =
             SchemaLoader::get(&compiler.loader,0x823456789abcdef1,brand,(Schema)0x21ec40);
        SVar4 = Schema::asStruct((Schema *)&root);
        orphanage.capTable = (CapTableBuilder *)SVar4.super_Schema.raw;
        makeExampleStruct((Orphan<capnp::DynamicStruct> *)&f,(anon_unknown_0 *)OVar7.arena,orphanage
                          ,SVar5,in_R9D);
        MessageBuilder::adoptRoot<capnp::DynamicStruct>
                  (&pMVar1->super_MessageBuilder,(Orphan<capnp::DynamicStruct> *)&f);
        _::OrphanBuilder::~OrphanBuilder(local_1a8);
      }
      SchemaLoader::getAllLoaded((Array<capnp::Schema> *)&root,&compiler.loader);
      SVar5 = root.schema;
      for (lVar6 = 0; (long)root.reader.segment << 3 != lVar6; lVar6 = lVar6 + 8) {
        schema.raw = *(RawBrandedSchema **)((long)SVar5.super_Schema.raw + lVar6);
        Schema::getProto((Reader *)&f,&schema);
        SchemaLoader::load(loader,(Reader *)&f);
      }
      kj::Array<capnp::Schema>::~Array((Array<capnp::Schema> *)&root);
      (__return_storage_ptr__->ptr).isSet = false;
    }
    else {
      Compiler::eagerlyCompile(&compiler,0x8123456789abcdef,1);
      pMVar1 = (messageBuilder->ptr).ptr;
      if (pMVar1 != (MallocMessageBuilder *)0x0) {
        auVar2 = ZEXT1640(ZEXT816(0));
        brand_00._reader._40_8_ = 0x7fffffff;
        brand_00._reader.segment = (SegmentReader *)auVar2._0_8_;
        brand_00._reader.capTable = (CapTableReader *)auVar2._8_8_;
        brand_00._reader.data = (void *)auVar2._16_8_;
        brand_00._reader.pointers = (WirePointer *)auVar2._24_8_;
        brand_00._reader.dataSize = auVar2._32_4_;
        brand_00._reader.pointerCount = auVar2._36_2_;
        brand_00._reader._38_2_ = auVar2._38_2_;
        schema = SchemaLoader::get(&compiler.loader,0x823456789abcdef1,brand_00,(Schema)0x21ec40);
        SVar5 = Schema::asStruct(&schema);
        MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                  ((Builder *)&f,&pMVar1->super_MessageBuilder,SVar5);
        DynamicStruct::Builder::asReader(&root,(Builder *)&f);
        schema.raw = (RawBrandedSchema *)&root;
        kj::_::Debug::Context::Context((Context *)&f);
        f.exception = (Exception *)&PTR__Context_0021bb68;
        reader.reader.segment = root.reader.segment;
        reader.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
        reader.reader.capTable = root.reader.capTable;
        reader.reader.data = root.reader.data;
        reader.reader.pointers = root.reader.pointers;
        reader.reader.dataSize = root.reader.dataSize;
        reader.reader.pointerCount = root.reader.pointerCount;
        reader.reader._38_2_ = root.reader._38_2_;
        reader.reader.nestingLimit = root.reader.nestingLimit;
        reader.reader._44_4_ = root.reader._44_4_;
        local_168 = &schema;
        checkExampleStruct(reader,sharedOrdinalCount);
        kj::_::Debug::Context::~Context((Context *)&f);
      }
      f.exception = (Exception *)&PTR_run_0021bbd0;
      local_1a8[0].tag.content = (uint64_t)&compiler;
      local_1a8[0].segment = (SegmentBuilder *)loader;
      kj::_::runCatchingExceptions(__return_storage_ptr__,(Runnable *)&f);
    }
    Compiler::~Compiler(&compiler);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
             ,0x2ad,FAILED,"compiler.add(module) == 0x8123456789abcdefllu","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

static kj::Maybe<kj::Exception> loadFile(
    ParsedFile::Reader file, SchemaLoader& loader, bool allNodes,
    kj::Maybe<kj::Own<MallocMessageBuilder>>& messageBuilder,
    uint sharedOrdinalCount) {
  Compiler compiler;
  ModuleImpl module(file);
  KJ_ASSERT(compiler.add(module) == 0x8123456789abcdefllu);

  if (allNodes) {
    // Eagerly compile and load the whole thing.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::ALL_RELATED_NODES);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Build an example struct using the compiled schema.
      m->get()->adoptRoot(makeExampleStruct(
          m->get()->getOrphanage(), compiler.getLoader().get(0x823456789abcdef1llu).asStruct(),
          sharedOrdinalCount));
    }

    for (auto schema: compiler.getLoader().getAllLoaded()) {
      loader.load(schema.getProto());
    }
    return nullptr;
  } else {
    // Compile the file root so that the children are findable, then load the specific child
    // we want.
    compiler.eagerlyCompile(0x8123456789abcdefllu, Compiler::NODE);

    KJ_IF_MAYBE(m, messageBuilder) {
      // Check that the example struct matches the compiled schema.
      auto root = m->get()->getRoot<DynamicStruct>(
          compiler.getLoader().get(0x823456789abcdef1llu).asStruct()).asReader();
      KJ_CONTEXT(root);
      checkExampleStruct(root, sharedOrdinalCount);
    }

    return kj::runCatchingExceptions([&]() {
      loadStructAndGroups(compiler.getLoader(), loader, 0x823456789abcdef1llu);
    });
  }
}